

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O0

char * cmime_message_generate_message_id(void)

{
  int iVar1;
  char *__name;
  size_t sVar2;
  char *__dest;
  int local_24;
  int local_20;
  int pos;
  int i2;
  int i;
  char *hostname;
  char *mid;
  
  local_24 = 0;
  __name = (char *)malloc(0x40);
  gethostname(__name,0x40);
  sVar2 = strlen(__name);
  __dest = (char *)malloc(sVar2 + 0x14);
  for (pos = 0; pos < 2; pos = pos + 1) {
    for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
      iVar1 = cmime_util_rand();
      __dest[local_24] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[iVar1 % 0x24];
      local_24 = local_24 + 1;
    }
    if (pos == 0) {
      __dest[local_24] = '.';
    }
    else {
      __dest[local_24] = '@';
    }
    local_24 = local_24 + 1;
  }
  __dest[local_24] = '\0';
  strcat(__dest,__name);
  free(__name);
  return __dest;
}

Assistant:

char *cmime_message_generate_message_id(void) {
    char *mid = NULL;
    char *hostname = NULL;
    static const char base36[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
    int i,i2;
    int pos = 0;

    hostname = (char *)malloc(MAXHOSTNAMELEN);
    gethostname(hostname,MAXHOSTNAMELEN);
        
    mid = (char *)malloc(20 + strlen(hostname));
    for(i=0; i < 2; i++) {
        for (i2=0; i2<8; i2++) 
            mid[pos++] = base36[cmime_util_rand() % 36];
        
        if (i==0)
            mid[pos++] = '.';
        else
            mid[pos++] = '@';
    }
    mid[pos] = '\0';
    strcat(mid,hostname);
    free(hostname);
    return(mid);
}